

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parsePin(LEFReader *this)

{
  bool bVar1;
  byte bVar2;
  token_t tVar3;
  ostream *poVar4;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  stringstream local_3c0 [8];
  stringstream ss_1;
  ostream local_3b0 [376];
  string local_238;
  stringstream local_218 [8];
  stringstream ss;
  ostream local_208 [376];
  undefined1 local_90 [8];
  string endName;
  string local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  string name;
  LEFReader *this_local;
  
  name.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = parsePinName(this,(string *)local_38);
  if (bVar1) {
    if (this->m_curtok == TOK_EOL) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  PIN: ");
      poVar4 = std::operator<<(poVar4,(string *)local_38);
      std::operator<<(poVar4,"\n");
      (*this->_vptr_LEFReader[9])(this,local_38);
      do {
        tVar3 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar3;
        if (this->m_curtok == TOK_IDENT) {
          bVar1 = std::operator==(&this->m_tokstr,"DIRECTION");
          if (bVar1) {
            parseDirection(this);
          }
          else {
            bVar1 = std::operator==(&this->m_tokstr,"USE");
            if (bVar1) {
              parseUse(this);
            }
            else {
              bVar1 = std::operator==(&this->m_tokstr,"PORT");
              if (bVar1) {
                parsePort(this);
              }
              else {
                bVar1 = std::operator==(&this->m_tokstr,"END");
                if (bVar1) {
                  std::__cxx11::string::string((string *)local_90);
                  bVar1 = parsePinName(this,(string *)local_90);
                  if (bVar1) {
                    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_90,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38);
                    if (bVar1) {
                      std::__cxx11::stringstream::stringstream(local_3c0);
                      poVar4 = std::operator<<(local_3b0,"Expected pin name ");
                      poVar4 = std::operator<<(poVar4,(string *)local_90);
                      std::operator<<(poVar4,"\n");
                      std::__cxx11::stringstream::str();
                      error(this,&local_3e0);
                      std::__cxx11::string::~string((string *)&local_3e0);
                      this_local._7_1_ = false;
                      local_48 = 1;
                      std::__cxx11::stringstream::~stringstream(local_3c0);
                    }
                    else if (this->m_curtok == TOK_EOL) {
                      this_local._7_1_ = true;
                      local_48 = 1;
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_400,"Expected EOL\n",&local_401);
                      error(this,&local_400);
                      std::__cxx11::string::~string((string *)&local_400);
                      std::allocator<char>::~allocator(&local_401);
                      this_local._7_1_ = false;
                      local_48 = 1;
                    }
                  }
                  else {
                    std::__cxx11::stringstream::stringstream(local_218);
                    poVar4 = std::operator<<(local_208,"Expected pin name ");
                    poVar4 = std::operator<<(poVar4,(string *)local_90);
                    std::operator<<(poVar4,"\n");
                    std::__cxx11::stringstream::str();
                    error(this,&local_238);
                    std::__cxx11::string::~string((string *)&local_238);
                    this_local._7_1_ = false;
                    local_48 = 1;
                    std::__cxx11::stringstream::~stringstream(local_218);
                  }
                  std::__cxx11::string::~string((string *)local_90);
                  goto LAB_0016a558;
                }
              }
            }
          }
        }
        bVar2 = std::ios::eof();
      } while ((bVar2 & 1) == 0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"Unexpected end of file\n",&local_429);
      error(this,&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator(&local_429);
      this_local._7_1_ = false;
      local_48 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Expected EOL\n",
                 (allocator<char> *)(endName.field_2._M_local_buf + 0xf));
      error(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)(endName.field_2._M_local_buf + 0xf));
      this_local._7_1_ = false;
      local_48 = 1;
    }
  }
  else {
    this_local._7_1_ = false;
    local_48 = 1;
  }
LAB_0016a558:
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parsePin()
{
    std::string name;
    
    if (!parsePinName(name))
    {
        return false;
    }

    // expect EOL
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL\n");
        return false;
    }

    std::cout << "  PIN: " << name << "\n";

    onPin(name);

    while(true)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok == TOK_IDENT)
        {
            if (m_tokstr == "DIRECTION")
            {
                parseDirection();
            }
            else if (m_tokstr == "USE")
            {
                parseUse();
            }            
            else if (m_tokstr == "PORT")
            {
                parsePort();
            }
            else if (m_tokstr == "END")
            {
                std::string endName;
                if (!parsePinName(endName))
                {
                    std::stringstream ss;
                    ss << "Expected pin name " << endName << "\n";
                    error(ss.str());
                    return false;
                }

                if (endName != name)
                {
                    std::stringstream ss;
                    ss << "Expected pin name " << endName << "\n";
                    error(ss.str());
                    return false;
                }

                if (m_curtok != TOK_EOL)
                {
                    error("Expected EOL\n");
                    return false;
                }

                return true;
            }           
        }

        if (m_is->eof())
        {
            error("Unexpected end of file\n");
            return false;
        }
    }
}